

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_of(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t *piVar6;
  JSValue this_obj;
  JSValue JVar7;
  JSValue val;
  JSValueUnion local_48;
  undefined8 local_40;
  
  local_48._4_4_ = 0;
  local_48.int32 = argc;
  local_40 = 0;
  this_obj = js_typed_array_create(ctx,this_val,1,(JSValue *)&local_48);
  if ((int)this_obj.tag == 6) {
LAB_0015d5a5:
    uVar4 = (ulong)this_obj.u.ptr & 0xffffffff00000000;
  }
  else {
    uVar5 = 0;
    uVar4 = (ulong)(uint)argc;
    if (argc < 1) {
      uVar4 = uVar5;
    }
    piVar6 = &argv->tag;
    do {
      if (uVar4 == uVar5) goto LAB_0015d5a5;
      JVar1 = (JSValueUnion)((JSValueUnion *)(piVar6 + -1))->ptr;
      iVar2 = *piVar6;
      if (0xfffffff4 < (uint)iVar2) {
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
      }
      val.tag = iVar2;
      val.u.ptr = JVar1.ptr;
      iVar3 = JS_SetPropertyUint32(ctx,this_obj,(uint32_t)uVar5,val);
      uVar5 = uVar5 + 1;
      piVar6 = piVar6 + 2;
    } while (-1 < iVar3);
    JS_FreeValue(ctx,this_obj);
    this_obj = (JSValue)(ZEXT816(6) << 0x40);
    uVar4 = 0;
  }
  JVar7.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar4);
  JVar7.tag = this_obj.tag;
  return JVar7;
}

Assistant:

static JSValue js_typed_array_of(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj;
    JSValueConst args[1];
    int i;

    args[0] = JS_NewInt32(ctx, argc);
    obj = js_typed_array_create(ctx, this_val, 1, args);
    if (JS_IsException(obj))
        return obj;

    for(i = 0; i < argc; i++) {
        if (JS_SetPropertyUint32(ctx, obj, i, JS_DupValue(ctx, argv[i])) < 0) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    }
    return obj;
}